

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_traversal.c
# Opt level: O0

void setsize_float(t_setsize *x,t_float f)

{
  t_gstub *ptVar1;
  char *pcVar2;
  int *piVar3;
  t_setsize *object;
  int iVar4;
  int iVar5;
  t_gpointer *gp_00;
  t_symbol *ptVar6;
  t_symbol *ptVar7;
  t_template *ptVar8;
  void *pvVar9;
  _glist *local_b0;
  _array *owner_array_1;
  t_word *ptStack_a0;
  int count_1;
  char *elem_1;
  t_word *ptStack_90;
  int count;
  char *elem;
  _array *owner_array;
  t_gstub *gs;
  t_gpointer *gp;
  int newsize;
  int elemsize;
  _array *array;
  t_atom at;
  t_word *w;
  t_template *elemtemplate;
  t_template *template;
  t_symbol *elemtemplatesym;
  t_symbol *fieldsym;
  t_symbol *templatesym;
  int type;
  int onset;
  int nitems;
  t_float f_local;
  t_setsize *x_local;
  
  elemtemplatesym = x->x_fieldsym;
  gp._0_4_ = (int)f;
  gp_00 = &x->x_gp;
  ptVar1 = (x->x_gp).gp_stub;
  onset = (int)f;
  _nitems = x;
  iVar4 = gpointer_check(&x->x_gp,0);
  if (iVar4 == 0) {
    pd_error(_nitems,"setsize: empty pointer");
  }
  else {
    if (*_nitems->x_templatesym->s_name == '\0') {
      fieldsym = gpointer_gettemplatesym(gp_00);
    }
    else {
      ptVar7 = _nitems->x_templatesym;
      fieldsym = ptVar7;
      ptVar6 = gpointer_gettemplatesym(gp_00);
      object = _nitems;
      if (ptVar7 != ptVar6) {
        pcVar2 = fieldsym->s_name;
        ptVar7 = gpointer_gettemplatesym(gp_00);
        pd_error(object,"setsize %s: got wrong template (%s)",pcVar2,ptVar7->s_name);
        return;
      }
    }
    ptVar8 = template_findbyname(fieldsym);
    if (ptVar8 == (t_template *)0x0) {
      pd_error(_nitems,"setsize: couldn\'t find template %s",fieldsym->s_name);
    }
    else {
      iVar4 = template_find_field(ptVar8,elemtemplatesym,(int *)((long)&templatesym + 4),
                                  (int *)&templatesym,(t_symbol **)&template);
      if (iVar4 == 0) {
        pd_error(_nitems,"setsize: couldn\'t find array field %s",elemtemplatesym->s_name);
      }
      else if ((int)templatesym == 3) {
        if (ptVar1->gs_which == 2) {
          at.a_w.w_symbol = *(t_symbol **)&gp_00->gp_un;
        }
        else {
          at.a_w.w_symbol = (t_symbol *)((gp_00->gp_un).gp_scalar)->sc_vec;
        }
        ptVar8 = template_findbyname((t_symbol *)template);
        if (ptVar8 == (t_template *)0x0) {
          pd_error(_nitems,"setsize: couldn\'t find field template %s",template->t_pdobj);
        }
        else {
          iVar4 = ptVar8->t_n * 8;
          piVar3 = *(int **)((long)&(at.a_w.w_symbol)->s_name + (long)templatesym._4_4_);
          if (iVar4 != piVar3[1]) {
            bug("setsize_gpointer");
          }
          type = *piVar3;
          if ((int)gp < 1) {
            gp._0_4_ = 1;
          }
          if ((int)gp != type) {
            if (ptVar1->gs_which == 1) {
              iVar5 = glist_isvisible((ptVar1->gs_un).gs_glist);
              if (iVar5 != 0) {
                gobj_vis(&((gp_00->gp_un).gp_scalar)->sc_gobj,(ptVar1->gs_un).gs_glist,0);
              }
            }
            else {
              elem = (char *)(ptVar1->gs_un).gs_glist;
              while (*(int *)(*(long *)(elem + 0x30) + 8) == 2) {
                elem = (char *)**(undefined8 **)(elem + 0x30);
              }
              iVar5 = glist_isvisible((_glist *)**(undefined8 **)(elem + 0x30));
              if (iVar5 != 0) {
                gobj_vis(*(t_gobj **)(elem + 0x20),(_glist *)**(undefined8 **)(elem + 0x30),0);
              }
            }
            if ((int)gp < type) {
              ptStack_90 = (t_word *)(*(long *)(piVar3 + 2) + (long)((int)gp * iVar4));
              elem_1._4_4_ = type - (int)gp;
              while (elem_1._4_4_ != 0) {
                word_free(ptStack_90,ptVar8);
                ptStack_90 = (t_word *)((long)ptStack_90 + (long)iVar4);
                elem_1._4_4_ = elem_1._4_4_ + -1;
              }
            }
            pvVar9 = resizebytes(*(void **)(piVar3 + 2),(long)(iVar4 * type),(long)(iVar4 * (int)gp)
                                );
            *(void **)(piVar3 + 2) = pvVar9;
            *piVar3 = (int)gp;
            if (type < (int)gp) {
              ptStack_a0 = (t_word *)(*(long *)(piVar3 + 2) + (long)(type * iVar4));
              owner_array_1._4_4_ = (int)gp - type;
              while (owner_array_1._4_4_ != 0) {
                word_init(ptStack_a0,ptVar8,gp_00);
                ptStack_a0 = (t_word *)((long)ptStack_a0 + (long)iVar4);
                owner_array_1._4_4_ = owner_array_1._4_4_ + -1;
              }
            }
            piVar3[6] = piVar3[6] + 1;
            if (ptVar1->gs_which == 1) {
              iVar4 = glist_isvisible((ptVar1->gs_un).gs_glist);
              if (iVar4 != 0) {
                gobj_vis(&((gp_00->gp_un).gp_scalar)->sc_gobj,(ptVar1->gs_un).gs_glist,1);
              }
            }
            else {
              local_b0 = (ptVar1->gs_un).gs_glist;
              while (*(int *)&local_b0->gl_list->g_next == 2) {
                local_b0 = (_glist *)local_b0->gl_list->g_pd;
              }
              iVar4 = glist_isvisible((_glist *)local_b0->gl_list->g_pd);
              if (iVar4 != 0) {
                gobj_vis((t_gobj *)(local_b0->gl_obj).te_inlet,(_glist *)local_b0->gl_list->g_pd,1);
              }
            }
          }
        }
      }
      else {
        pd_error(_nitems,"setsize: field %s not of type array",elemtemplatesym->s_name);
      }
    }
  }
  return;
}

Assistant:

static void setsize_float(t_setsize *x, t_float f)
{
    int nitems, onset, type;
    t_symbol *templatesym, *fieldsym = x->x_fieldsym, *elemtemplatesym;
    t_template *template;
    t_template *elemtemplate;
    t_word *w;
    t_atom at;
    t_array *array;
    int elemsize;
    int newsize = f;
    t_gpointer *gp = &x->x_gp;
    t_gstub *gs = gp->gp_stub;
    if (!gpointer_check(&x->x_gp, 0))
    {
        pd_error(x, "setsize: empty pointer");
        return;
    }
    if (*x->x_templatesym->s_name)
    {
        if ((templatesym = x->x_templatesym) !=
            gpointer_gettemplatesym(gp))
        {
            pd_error(x, "setsize %s: got wrong template (%s)",
                templatesym->s_name, gpointer_gettemplatesym(gp)->s_name);
            return;
        }
    }
    else templatesym = gpointer_gettemplatesym(gp);
    if (!(template = template_findbyname(templatesym)))
    {
        pd_error(x, "setsize: couldn't find template %s", templatesym->s_name);
        return;
    }

    if (!template_find_field(template, fieldsym,
        &onset, &type, &elemtemplatesym))
    {
        pd_error(x,"setsize: couldn't find array field %s", fieldsym->s_name);
        return;
    }
    if (type != DT_ARRAY)
    {
        pd_error(x,"setsize: field %s not of type array", fieldsym->s_name);
        return;
    }
    if (gs->gs_which == GP_ARRAY) w = gp->gp_un.gp_w;
    else w = gp->gp_un.gp_scalar->sc_vec;

    if (!(elemtemplate = template_findbyname(elemtemplatesym)))
    {
        pd_error(x,"setsize: couldn't find field template %s",
            elemtemplatesym->s_name);
        return;
    }

    elemsize = elemtemplate->t_n * sizeof(t_word);

    array = *(t_array **)(((char *)w) + onset);

    if (elemsize != array->a_elemsize) bug("setsize_gpointer");

    nitems = array->a_n;
    if (newsize < 1) newsize = 1;
    if (newsize == nitems) return;

        /* erase the array before resizing it.  If we belong to a
        scalar it's easy, but if we belong to an element of another
        array we have to search back until we get to a scalar to erase.
        When graphics updates become queueable this may fall apart... */


    if (gs->gs_which == GP_GLIST)
    {
        if (glist_isvisible(gs->gs_un.gs_glist))
            gobj_vis((t_gobj *)(gp->gp_un.gp_scalar), gs->gs_un.gs_glist, 0);
    }
    else
    {
        t_array *owner_array = gs->gs_un.gs_array;
        while (owner_array->a_gp.gp_stub->gs_which == GP_ARRAY)
            owner_array = owner_array->a_gp.gp_stub->gs_un.gs_array;
        if (glist_isvisible(owner_array->a_gp.gp_stub->gs_un.gs_glist))
            gobj_vis((t_gobj *)(owner_array->a_gp.gp_un.gp_scalar),
                owner_array->a_gp.gp_stub->gs_un.gs_glist, 0);
    }
        /* if shrinking, free the scalars that will disappear */
    if (newsize < nitems)
    {
        char *elem;
        int count;
        for (elem = ((char *)array->a_vec) + newsize * elemsize,
            count = nitems - newsize; count--; elem += elemsize)
                word_free((t_word *)elem, elemtemplate);
    }
        /* resize the array  */
    array->a_vec = (char *)resizebytes(array->a_vec,
        elemsize * nitems, elemsize * newsize);
    array->a_n = newsize;
        /* if growing, initialize new scalars */
    if (newsize > nitems)
    {
        char *elem;
        int count;
        for (elem = ((char *)array->a_vec) + nitems * elemsize,
            count = newsize - nitems; count--; elem += elemsize)
                word_init((t_word *)elem, elemtemplate, gp);
    }
        /* invalidate all gpointers into the array */
    array->a_valid++;

    /* redraw again. */
    if (gs->gs_which == GP_GLIST)
    {
        if (glist_isvisible(gs->gs_un.gs_glist))
            gobj_vis((t_gobj *)(gp->gp_un.gp_scalar), gs->gs_un.gs_glist, 1);
    }
    else
    {
        t_array *owner_array = gs->gs_un.gs_array;
        while (owner_array->a_gp.gp_stub->gs_which == GP_ARRAY)
            owner_array = owner_array->a_gp.gp_stub->gs_un.gs_array;
        if (glist_isvisible(owner_array->a_gp.gp_stub->gs_un.gs_glist))
            gobj_vis((t_gobj *)(owner_array->a_gp.gp_un.gp_scalar),
                owner_array->a_gp.gp_stub->gs_un.gs_glist, 1);
    }
}